

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

_Bool aa32_generate_debug_exceptions(CPUARMState_conflict *env)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  int spd;
  int el;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  if ((iVar2 == 0) && (_Var1 = arm_el_is_aa64(env,1), _Var1)) {
    _Var1 = aa64_generate_debug_exceptions(env);
    return _Var1;
  }
  _Var1 = arm_is_secure(env);
  if (_Var1) {
    if ((iVar2 == 0) && (((env->cp15).sder & 1) != 0)) {
      return true;
    }
    uVar3 = extract32((uint32_t)(env->cp15).mdcr_el3,0xe,2);
    if (uVar3 < 2) {
      return true;
    }
    if (uVar3 == 2) {
      return false;
    }
    if (uVar3 == 3) {
      return true;
    }
  }
  return iVar2 != 2;
}

Assistant:

static inline bool aa32_generate_debug_exceptions(CPUARMState *env)
{
    int el = arm_current_el(env);

    if (el == 0 && arm_el_is_aa64(env, 1)) {
        return aa64_generate_debug_exceptions(env);
    }

    if (arm_is_secure(env)) {
        int spd;

        if (el == 0 && (env->cp15.sder & 1)) {
            /* SDER.SUIDEN means debug exceptions from Secure EL0
             * are always enabled. Otherwise they are controlled by
             * SDCR.SPD like those from other Secure ELs.
             */
            return true;
        }

        spd = extract32(env->cp15.mdcr_el3, 14, 2);
        switch (spd) {
        case 1:
            /* SPD == 0b01 is reserved, but behaves as 0b00. */
        case 0:
            /* For 0b00 we return true if external secure invasive debug
             * is enabled. On real hardware this is controlled by external
             * signals to the core. QEMU always permits debug, and behaves
             * as if DBGEN, SPIDEN, NIDEN and SPNIDEN are all tied high.
             */
            return true;
        case 2:
            return false;
        case 3:
            return true;
        }
    }

    return el != 2;
}